

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetAllPropertiesToUndefined
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          bool invalidateFixedFields)

{
  PropertyRecord *this_00;
  unsigned_short uVar1;
  int iVar2;
  PropertyId propertyKey;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar3;
  PropertyRecord **ppPVar4;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar5;
  JavascriptLibrary *pJVar6;
  RecyclableObject *value;
  JavascriptFunction *value_00;
  unsigned_short dataPropertyIndex;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor_1;
  int propertyIndex_1;
  JavascriptFunction *defaultAccessor;
  RecyclableObject *undefined;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyRecord *propertyRecord;
  int propertyIndex;
  int propertyCount;
  bool invalidateFixedFields_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  DynamicTypeHandler::ChangeFlags(&this->super_DynamicTypeHandler,0xc1,'\x01');
  pBVar3 = Memory::
           WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
           ::operator->(&this->propertyMap);
  iVar2 = JsUtil::
          BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Count(pBVar3);
  if (invalidateFixedFields) {
    for (propertyRecord._4_4_ = 0; propertyRecord._4_4_ < iVar2;
        propertyRecord._4_4_ = propertyRecord._4_4_ + 1) {
      pBVar3 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
               ::operator->(&this->propertyMap);
      ppPVar4 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetKeyAt(pBVar3,propertyRecord._4_4_);
      this_00 = *ppPVar4;
      pBVar3 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
               ::operator->(&this->propertyMap);
      pDVar5 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetReferenceAt(pBVar3,propertyRecord._4_4_);
      propertyKey = PropertyRecord::GetPropertyId(this_00);
      InvalidateFixedField<int>(this,instance,propertyKey,pDVar5);
    }
  }
  pJVar6 = RecyclableObject::GetLibrary(&instance->super_RecyclableObject);
  value = JavascriptLibraryBase::GetUndefined(&pJVar6->super_JavascriptLibraryBase);
  pJVar6 = RecyclableObject::GetLibrary(&instance->super_RecyclableObject);
  value_00 = JavascriptLibrary::GetDefaultAccessorFunction(pJVar6);
  for (descriptor_1._4_4_ = 0; descriptor_1._4_4_ < iVar2;
      descriptor_1._4_4_ = descriptor_1._4_4_ + 1) {
    pBVar3 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->propertyMap);
    pDVar5 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetReferenceAt(pBVar3,descriptor_1._4_4_);
    uVar1 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(pDVar5);
    if (uVar1 == 0xffff) {
      uVar1 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(pDVar5);
      DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar1,value_00);
      uVar1 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar5);
      DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar1,value_00);
    }
    else {
      DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar1,value);
    }
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetAllPropertiesToUndefined(DynamicObject* instance, bool invalidateFixedFields)
    {
        // The Var for window is reused across navigation. we shouldn't preserve the IsExtensibleFlag when we don't keep
        // the expandos. Reset the IsExtensibleFlag in cleanup scenario should be good enough
        // to cover all the preventExtension/Freeze/Seal scenarios.
        // Note that we don't change the flag for keepProperties scenario: the flags should be preserved and that's consistent
        // with other browsers.
        ChangeFlags(IsExtensibleFlag | IsSealedOnceFlag | IsFrozenOnceFlag, IsExtensibleFlag);

        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.
        int propertyCount = this->propertyMap->Count();

#if ENABLE_FIXED_FIELDS
        if (invalidateFixedFields)
        {
            for (int propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
            {
                const PropertyRecord* propertyRecord = this->propertyMap->GetKeyAt(propertyIndex);
                DictionaryPropertyDescriptor<T>* descriptor = this->propertyMap->GetReferenceAt(propertyIndex);
                InvalidateFixedField(instance, propertyRecord->GetPropertyId(), descriptor);
            }
        }
#endif

        Js::RecyclableObject* undefined = instance->GetLibrary()->GetUndefined();
        Js::JavascriptFunction* defaultAccessor = instance->GetLibrary()->GetDefaultAccessorFunction();
        for (int propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
        {
            DictionaryPropertyDescriptor<T>* descriptor = this->propertyMap->GetReferenceAt(propertyIndex);

            T dataPropertyIndex = descriptor->template GetDataPropertyIndex<false>();
            if (dataPropertyIndex != NoSlots)
            {
                SetSlotUnchecked(instance, dataPropertyIndex, undefined);
            }
            else
            {
                SetSlotUnchecked(instance, descriptor->GetGetterPropertyIndex(), defaultAccessor);
                SetSlotUnchecked(instance, descriptor->GetSetterPropertyIndex(), defaultAccessor);
            }
        }
    }